

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O0

_Bool msgpack_unpacker_init(msgpack_unpacker *mpac,size_t initial_buffer_size)

{
  char *__ptr;
  void *__ptr_00;
  msgpack_zone *pmVar1;
  msgpack_zone *z;
  void *ctx;
  char *buffer;
  size_t initial_buffer_size_local;
  msgpack_unpacker *mpac_local;
  
  buffer = (char *)initial_buffer_size;
  if (initial_buffer_size < 4) {
    buffer = (char *)0x4;
  }
  __ptr = (char *)malloc((size_t)buffer);
  if (__ptr == (char *)0x0) {
    mpac_local._7_1_ = false;
  }
  else {
    __ptr_00 = malloc(0x820);
    if (__ptr_00 == (void *)0x0) {
      free(__ptr);
      mpac_local._7_1_ = false;
    }
    else {
      pmVar1 = msgpack_zone_new(0x2000);
      if (pmVar1 == (msgpack_zone *)0x0) {
        free(__ptr_00);
        free(__ptr);
        mpac_local._7_1_ = false;
      }
      else {
        mpac->buffer = __ptr;
        mpac->used = 4;
        mpac->free = (long)buffer - mpac->used;
        mpac->off = 4;
        mpac->parsed = 0;
        mpac->initial_buffer_size = (size_t)buffer;
        mpac->z = pmVar1;
        mpac->ctx = __ptr_00;
        init_count(mpac->buffer);
        template_init((template_context *)mpac->ctx);
        *(msgpack_zone **)mpac->ctx = mpac->z;
        *(undefined1 *)((long)mpac->ctx + 8) = 0;
        mpac_local._7_1_ = true;
      }
    }
  }
  return mpac_local._7_1_;
}

Assistant:

bool msgpack_unpacker_init(msgpack_unpacker* mpac, size_t initial_buffer_size)
{
    char* buffer;
    void* ctx;
    msgpack_zone* z;

    if(initial_buffer_size < COUNTER_SIZE) {
        initial_buffer_size = COUNTER_SIZE;
    }

    buffer = (char*)malloc(initial_buffer_size);
    if(buffer == NULL) {
        return false;
    }

    ctx = malloc(sizeof(template_context));
    if(ctx == NULL) {
        free(buffer);
        return false;
    }

    z = msgpack_zone_new(MSGPACK_ZONE_CHUNK_SIZE);
    if(z == NULL) {
        free(ctx);
        free(buffer);
        return false;
    }

    mpac->buffer = buffer;
    mpac->used = COUNTER_SIZE;
    mpac->free = initial_buffer_size - mpac->used;
    mpac->off = COUNTER_SIZE;
    mpac->parsed = 0;
    mpac->initial_buffer_size = initial_buffer_size;
    mpac->z = z;
    mpac->ctx = ctx;

    init_count(mpac->buffer);

    template_init(CTX_CAST(mpac->ctx));
    CTX_CAST(mpac->ctx)->user.z = mpac->z;
    CTX_CAST(mpac->ctx)->user.referenced = false;

    return true;
}